

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_hdwallet.h
# Opt level: O3

void __thiscall cfd::core::KeyData::KeyData(KeyData *this,KeyData *param_1)

{
  undefined3 uVar1;
  NetType NVar2;
  uint32_t uVar3;
  uint8_t uVar4;
  uint32_t uVar5;
  
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)this,
             (vector<unsigned_char,_std::allocator<unsigned_char>_> *)param_1);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&this->privkey_,
             (vector<unsigned_char,_std::allocator<unsigned_char>_> *)&param_1->privkey_);
  uVar1 = *(undefined3 *)&(param_1->privkey_).field_0x19;
  NVar2 = (param_1->privkey_).net_type_;
  (this->privkey_).is_compressed_ = (param_1->privkey_).is_compressed_;
  *(undefined3 *)&(this->privkey_).field_0x19 = uVar1;
  (this->privkey_).net_type_ = NVar2;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&this->extprivkey_,
             (vector<unsigned_char,_std::allocator<unsigned_char>_> *)&param_1->extprivkey_);
  uVar3 = (param_1->extprivkey_).fingerprint_;
  uVar4 = (param_1->extprivkey_).depth_;
  uVar1 = *(undefined3 *)&(param_1->extprivkey_).field_0x21;
  uVar5 = (param_1->extprivkey_).child_num_;
  (this->extprivkey_).version_ = (param_1->extprivkey_).version_;
  (this->extprivkey_).fingerprint_ = uVar3;
  (this->extprivkey_).depth_ = uVar4;
  *(undefined3 *)&(this->extprivkey_).field_0x21 = uVar1;
  (this->extprivkey_).child_num_ = uVar5;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            (&(this->extprivkey_).chaincode_.data_,&(param_1->extprivkey_).chaincode_.data_);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&(this->extprivkey_).privkey_,
             (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
             &(param_1->extprivkey_).privkey_);
  uVar1 = *(undefined3 *)&(param_1->extprivkey_).privkey_.field_0x19;
  NVar2 = (param_1->extprivkey_).privkey_.net_type_;
  (this->extprivkey_).privkey_.is_compressed_ = (param_1->extprivkey_).privkey_.is_compressed_;
  *(undefined3 *)&(this->extprivkey_).privkey_.field_0x19 = uVar1;
  (this->extprivkey_).privkey_.net_type_ = NVar2;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            (&(this->extprivkey_).tweak_sum_.data_,&(param_1->extprivkey_).tweak_sum_.data_);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&this->extpubkey_,
             (vector<unsigned_char,_std::allocator<unsigned_char>_> *)&param_1->extpubkey_);
  uVar3 = (param_1->extpubkey_).fingerprint_;
  uVar4 = (param_1->extpubkey_).depth_;
  uVar1 = *(undefined3 *)&(param_1->extpubkey_).field_0x21;
  uVar5 = (param_1->extpubkey_).child_num_;
  (this->extpubkey_).version_ = (param_1->extpubkey_).version_;
  (this->extpubkey_).fingerprint_ = uVar3;
  (this->extpubkey_).depth_ = uVar4;
  *(undefined3 *)&(this->extpubkey_).field_0x21 = uVar1;
  (this->extpubkey_).child_num_ = uVar5;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            (&(this->extpubkey_).chaincode_.data_,&(param_1->extpubkey_).chaincode_.data_);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&(this->extpubkey_).pubkey_,
             (vector<unsigned_char,_std::allocator<unsigned_char>_> *)&(param_1->extpubkey_).pubkey_
            );
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            (&(this->extpubkey_).tweak_sum_.data_,&(param_1->extpubkey_).tweak_sum_.data_);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&this->path_,&param_1->path_);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            (&(this->fingerprint_).data_,&(param_1->fingerprint_).data_);
  return;
}

Assistant:

class CFD_CORE_EXPORT KeyData {
 public:
  /**
   * @brief constructor.
   */
  KeyData();
  /**
   * @brief Get key text information from ext-privkey.
   * @param[in] ext_privkey  privkey
   * @param[in] child_path   bip32 path for child.
   * @param[in] finterprint     master-pubkey fingerprint
   */
  explicit KeyData(
      const ExtPrivkey& ext_privkey, const std::string& child_path,
      const ByteData& finterprint);
  /**
   * @brief Get key text information from ext-pubkey.
   * @param[in] ext_pubkey   pubkey
   * @param[in] child_path   bip32 path for child.
   * @param[in] finterprint     master-pubkey fingerprint
   */
  explicit KeyData(
      const ExtPubkey& ext_pubkey, const std::string& child_path,
      const ByteData& finterprint);
  /**
   * @brief Get key text information from privkey.
   * @param[in] privkey   privkey
   * @param[in] child_path   bip32 path for child.
   * @param[in] finterprint     master-pubkey fingerprint
   */
  explicit KeyData(
      const Privkey& privkey, const std::string& child_path,
      const ByteData& finterprint);
  /**
   * @brief Get key text information from pubkey.
   * @param[in] pubkey   pubkey
   * @param[in] child_path   bip32 path for child.
   * @param[in] finterprint     master-pubkey fingerprint
   */
  explicit KeyData(
      const Pubkey& pubkey, const std::string& child_path,
      const ByteData& finterprint);
  /**
   * @brief Get key text information from ext-privkey.
   * @param[in] ext_privkey  privkey
   * @param[in] child_num_list   bip32 path for child.
   * @param[in] finterprint     master-pubkey fingerprint
   */
  explicit KeyData(
      const ExtPrivkey& ext_privkey,
      const std::vector<uint32_t>& child_num_list,
      const ByteData& finterprint);
  /**
   * @brief Get key text information from ext-pubkey.
   * @param[in] ext_pubkey   pubkey
   * @param[in] child_num_list   bip32 path for child.
   * @param[in] finterprint     master-pubkey fingerprint
   */
  explicit KeyData(
      const ExtPubkey& ext_pubkey, const std::vector<uint32_t>& child_num_list,
      const ByteData& finterprint);
  /**
   * @brief Get key text information from privkey.
   * @param[in] privkey   privkey
   * @param[in] child_num_list   bip32 path for child.
   * @param[in] finterprint     master-pubkey fingerprint
   */
  explicit KeyData(
      const Privkey& privkey, const std::vector<uint32_t>& child_num_list,
      const ByteData& finterprint);
  /**
   * @brief Get key text information from pubkey.
   * @param[in] pubkey   pubkey
   * @param[in] child_num_list   bip32 path for child.
   * @param[in] finterprint     master-pubkey fingerprint
   */
  explicit KeyData(
      const Pubkey& pubkey, const std::vector<uint32_t>& child_num_list,
      const ByteData& finterprint);
  /**
   * @brief Get key text information from string.
   * @param[in] path_info   key-path info.
   * @param[in] child_num   child number to use if an asterisk is used.
   * @param[in] has_schnorr_pubkey   schnorr(xonly) pubkey used.
   */
  explicit KeyData(
      const std::string& path_info, int32_t child_num = -1,
      bool has_schnorr_pubkey = false);

  /**
   * @brief exist ext-privkey.
   * @retval true  exist
   * @retval false not exist
   */
  bool HasExtPrivkey() const;
  /**
   * @brief exist ext-pubkey.
   * @retval true  exist
   * @retval false not exist
   */
  bool HasExtPubkey() const;
  /**
   * @brief exist privkey.
   * @retval true  exist
   * @retval false not exist
   */
  bool HasPrivkey() const;
  /**
   * @brief getting pubkey.
   * @return pubkey
   */
  Pubkey GetPubkey() const;
  /**
   * @brief getting privkey.
   * @return privkey
   */
  Privkey GetPrivkey() const;
  /**
   * @brief getting ext-privkey.
   * @details need ext-privkey exists.
   * @return ext-privkey
   */
  ExtPrivkey GetExtPrivkey() const;
  /**
   * @brief getting ext-pubkey.
   * @details need ext-pubkey exists.
   * @return ext-pubkey
   */
  ExtPubkey GetExtPubkey() const;

  /**
   * @brief Derive ext-privkey.
   * @param[in] path  path
   * @param[in] has_rebase_path  rebase path/fingerprint base
   * @return path info with ext-privkey.
   */
  KeyData DerivePrivkey(
      std::vector<uint32_t> path, bool has_rebase_path) const;
  /**
   * @brief Derive ext-privkey.
   * @param[in] path  path
   * @param[in] has_rebase_path  rebase path/fingerprint base
   * @return path info with ext-privkey.
   */
  KeyData DerivePrivkey(std::string path, bool has_rebase_path) const;
  /**
   * @brief Derive ext-pubkey.
   * @param[in] path  path
   * @param[in] has_rebase_path  rebase path/fingerprint base
   * @return path info with ext-pubkey.
   */
  KeyData DerivePubkey(std::vector<uint32_t> path, bool has_rebase_path) const;
  /**
   * @brief Derive ext-pubkey.
   * @param[in] path  path
   * @param[in] has_rebase_path  rebase path/fingerprint base
   * @return path info with ext-pubkey.
   */
  KeyData DerivePubkey(std::string path, bool has_rebase_path) const;

  /**
   * @brief getting bip32 path.
   * @param[in] hardened_type  hardened string type
   * @param[in] has_hex  using hex string
   * @return bip32 path
   */
  std::string GetBip32Path(
      HardenedType hardened_type = HardenedType::kApostrophe,
      bool has_hex = false) const;
  /**
   * @brief get message string.
   * @param[in] has_pubkey  displays the pubkey string.
   * @param[in] hardened_type  hardened string type
   * @param[in] has_hex  using hex string
   * @return message string.
   */
  std::string ToString(
      bool has_pubkey = true,
      HardenedType hardened_type = HardenedType::kApostrophe,
      bool has_hex = false) const;
  /**
   * @brief get fingerprint.
   * @return fingerprint.
   */
  ByteData GetFingerprint() const;
  /**
   * @brief get child number array.
   * @return child number array.
   */
  std::vector<uint32_t> GetChildNumArray() const;
  /**
   * @brief check valid.
   * @retval true   valid
   * @retval false  invalid
   */
  bool IsValid() const;

 private:
  Pubkey pubkey_;               //!< pubkey
  Privkey privkey_;             //!< privkey
  ExtPrivkey extprivkey_;       //!< ext privkey
  ExtPubkey extpubkey_;         //!< ext pubkey
  std::vector<uint32_t> path_;  //!< bip32 path
  ByteData fingerprint_;        //!< fingerprint by key string
}